

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  ErrorFormat EVar1;
  pointer pbVar2;
  pointer pOVar3;
  GeneratorContextImpl *pGVar4;
  _Rb_tree_header *p_Var5;
  pointer puVar6;
  pointer ppDVar7;
  bool bVar8;
  ParseArgumentStatus PVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  SimpleDescriptorDatabase *this_00;
  Type *pTVar13;
  ostream *poVar14;
  char *pcVar15;
  DescriptorPool *this_01;
  size_type sVar16;
  mapped_type *pmVar17;
  GeneratorContextImpl *pGVar18;
  MergedDescriptorDatabase *this_02;
  LogMessage *pLVar19;
  DescriptorProto *pDVar20;
  FileDescriptor *pFVar21;
  DiskSourceTree *source_tree;
  undefined8 *puVar22;
  pointer pbVar23;
  __node_base _Var24;
  ulong uVar25;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  *db;
  pointer puVar26;
  long lVar27;
  int j;
  long lVar28;
  StringPiece str_00;
  StringPiece str_01;
  StringPiece str_02;
  int local_2c0;
  SourceTreeDescriptorDatabase *local_2b8;
  MultiFileErrorCollector *local_2a8;
  DiskSourceTree *local_2a0;
  LogFinisher local_291;
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  descriptor_pool;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  databases_per_descriptor_set;
  GeneratorContextMap output_directories;
  StringPiece local_218;
  StringPiece local_208;
  StringPiece local_1f8;
  StringPiece local_1e8;
  StringPiece local_1d8;
  StringPiece local_1c8;
  StringPiece local_1b8;
  FileDescriptorSet file_descriptor_set;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  raw_databases_per_descriptor_set;
  RepeatedPtrField<google::protobuf::DescriptorProto> local_118 [5];
  ArenaStringPtr local_98 [6];
  LogMessage local_68;
  
  Clear(this);
  PVar9 = ParseArguments(this,argc,argv);
  if (PVar9 == PARSE_ARGUMENT_DONE_AND_EXIT) {
    return 0;
  }
  if (PVar9 == PARSE_ARGUMENT_FAIL) {
    return 1;
  }
  parsed_files.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptor_pool._M_t.
  super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
  .super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>,_true,_true>
        )(__uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
          )0x0;
  parsed_files.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsed_files.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  databases_per_descriptor_set.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  databases_per_descriptor_set.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  databases_per_descriptor_set.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar23 = (this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->descriptor_set_in_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar23 == pbVar2) {
    this_02 = (MergedDescriptorDatabase *)0x0;
  }
  else {
    local_2c0 = 1;
    for (; pbVar23 != pbVar2; pbVar23 = pbVar23 + 1) {
      while (iVar10 = open((pbVar23->_M_dataplus)._M_p,0), iVar10 < 0) {
        piVar12 = __errno_location();
        if (*piVar12 != 4) {
          poVar14 = std::operator<<((ostream *)&std::cerr,(string *)pbVar23);
          poVar14 = std::operator<<(poVar14,": ");
          pcVar15 = strerror(2);
          poVar14 = std::operator<<(poVar14,pcVar15);
          std::endl<char,std::char_traits<char>>(poVar14);
          goto LAB_0027d8de;
        }
      }
      FileDescriptorSet::FileDescriptorSet(&file_descriptor_set);
      bVar8 = MessageLite::ParseFromFileDescriptor((MessageLite *)&file_descriptor_set,iVar10);
      iVar10 = close(iVar10);
      if (iVar10 == 0) {
        if (!bVar8) {
          poVar14 = std::operator<<((ostream *)&std::cerr,(string *)pbVar23);
          poVar14 = std::operator<<(poVar14,": Unable to parse.");
          std::endl<char,std::char_traits<char>>(poVar14);
          goto LAB_0027d837;
        }
        this_00 = (SimpleDescriptorDatabase *)operator_new(0xb0);
        SimpleDescriptorDatabase::SimpleDescriptorDatabase(this_00);
        for (iVar10 = 0; iVar10 < file_descriptor_set.file_.super_RepeatedPtrFieldBase.current_size_
            ; iVar10 = iVar10 + 1) {
          FileDescriptorProto::FileDescriptorProto
                    ((FileDescriptorProto *)&raw_databases_per_descriptor_set);
          pTVar13 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                              (&file_descriptor_set.file_.super_RepeatedPtrFieldBase,iVar10);
          iVar11 = (*(this_00->super_DescriptorDatabase)._vptr_DescriptorDatabase[2])
                             (this_00,(ulong)(pTVar13->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,
                              (FileDescriptorProto *)&raw_databases_per_descriptor_set);
          if ((char)iVar11 == '\0') {
            pTVar13 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                                (&file_descriptor_set.file_.super_RepeatedPtrFieldBase,iVar10);
            bVar8 = SimpleDescriptorDatabase::Add(this_00,pTVar13);
            if (!bVar8) {
              output_directories._M_h._M_buckets = (__buckets_ptr)0x0;
              FileDescriptorProto::~FileDescriptorProto
                        ((FileDescriptorProto *)&raw_databases_per_descriptor_set);
              (*(this_00->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])(this_00);
              this_00 = (SimpleDescriptorDatabase *)output_directories._M_h._M_buckets;
              break;
            }
          }
          FileDescriptorProto::~FileDescriptorProto
                    ((FileDescriptorProto *)&raw_databases_per_descriptor_set);
        }
      }
      else {
        poVar14 = std::operator<<((ostream *)&std::cerr,(string *)pbVar23);
        poVar14 = std::operator<<(poVar14,": close: ");
        piVar12 = __errno_location();
        pcVar15 = strerror(*piVar12);
        poVar14 = std::operator<<(poVar14,pcVar15);
        std::endl<char,std::char_traits<char>>(poVar14);
LAB_0027d837:
        output_directories._M_h._M_buckets = (__buckets_ptr)0x0;
        this_00 = (SimpleDescriptorDatabase *)output_directories._M_h._M_buckets;
      }
      output_directories._M_h._M_buckets = (__buckets_ptr)this_00;
      FileDescriptorSet::~FileDescriptorSet(&file_descriptor_set);
      if (output_directories._M_h._M_buckets == (__buckets_ptr)0x0) {
LAB_0027d8de:
        local_2a8 = (MultiFileErrorCollector *)0x0;
        local_2a0 = (DiskSourceTree *)0x0;
        goto LAB_0027e144;
      }
      std::
      vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>
                ((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
                  *)&databases_per_descriptor_set,
                 (unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                  *)&output_directories);
      if (output_directories._M_h._M_buckets != (__buckets_ptr)0x0) {
        (*(code *)(*output_directories._M_h._M_buckets)[1]._M_nxt)();
      }
    }
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_databases_per_descriptor_set.
    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::reserve(&raw_databases_per_descriptor_set,
              (long)databases_per_descriptor_set.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)databases_per_descriptor_set.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar6 = databases_per_descriptor_set.
             super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar26 = databases_per_descriptor_set.
                   super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar26 != puVar6;
        puVar26 = puVar26 + 1) {
      file_descriptor_set.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)
           (puVar26->_M_t).
           super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
           .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>._M_head_impl;
      std::
      vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
      ::emplace_back<google::protobuf::DescriptorDatabase*>
                ((vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
                  *)&raw_databases_per_descriptor_set,(DescriptorDatabase **)&file_descriptor_set);
    }
    this_02 = (MergedDescriptorDatabase *)operator_new(0x20);
    MergedDescriptorDatabase::MergedDescriptorDatabase(this_02,&raw_databases_per_descriptor_set);
    std::
    _Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::~_Vector_base(&raw_databases_per_descriptor_set.
                     super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                   );
  }
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar8 = VerifyInputFilesInDescriptors(this,&this_02->super_DescriptorDatabase);
    if (!bVar8) {
      local_2a0 = (DiskSourceTree *)0x0;
      goto LAB_0027db62;
    }
    local_2a8 = (MultiFileErrorCollector *)operator_new(0x30);
    EVar1 = this->error_format_;
    local_2a8->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004d7310;
    local_2a8[1]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_004d7360;
    local_2a8[2]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004d7390;
    *(ErrorFormat *)&local_2a8[3]._vptr_MultiFileErrorCollector = EVar1;
    local_2a8[4]._vptr_MultiFileErrorCollector = (_func_int **)0x0;
    *(undefined2 *)&local_2a8[5]._vptr_MultiFileErrorCollector = 0;
    this_01 = (DescriptorPool *)operator_new(0x60);
    DescriptorPool::DescriptorPool
              (this_01,&this_02->super_DescriptorDatabase,(ErrorCollector *)(local_2a8 + 2));
    local_2b8 = (SourceTreeDescriptorDatabase *)0x0;
    local_2a0 = (DiskSourceTree *)0x0;
  }
  else {
    local_2a0 = (DiskSourceTree *)operator_new(0x40);
    DiskSourceTree::DiskSourceTree(local_2a0);
    bVar8 = InitializeDiskSourceTree(this,local_2a0,&this_02->super_DescriptorDatabase);
    if (!bVar8) {
LAB_0027db62:
      local_2c0 = 1;
      local_2a8 = (MultiFileErrorCollector *)0x0;
      goto LAB_0027e136;
    }
    local_2a8 = (MultiFileErrorCollector *)operator_new(0x30);
    EVar1 = this->error_format_;
    local_2a8->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004d7310;
    local_2a8[1]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_004d7360;
    local_2a8[2]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004d7390;
    *(ErrorFormat *)&local_2a8[3]._vptr_MultiFileErrorCollector = EVar1;
    local_2a8[4]._vptr_MultiFileErrorCollector = (_func_int **)local_2a0;
    *(undefined2 *)&local_2a8[5]._vptr_MultiFileErrorCollector = 0;
    local_2b8 = (SourceTreeDescriptorDatabase *)operator_new(0x98);
    SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
              (local_2b8,(SourceTree *)local_2a0,&this_02->super_DescriptorDatabase);
    local_2b8->error_collector_ = local_2a8;
    this_01 = (DescriptorPool *)operator_new(0x60);
    local_2b8->using_validation_error_collector_ = true;
    DescriptorPool::DescriptorPool
              (this_01,(DescriptorDatabase *)local_2b8,
               &(local_2b8->validation_error_collector_).super_ErrorCollector);
  }
  std::
  __uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::reset((__uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
           *)&descriptor_pool,this_01);
  *(undefined1 *)
   ((long)descriptor_pool._M_t.
          super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
          .super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>._M_head_impl + 0x2b) = 1
  ;
  bVar8 = ParseInputFiles(this,(DescriptorPool *)
                               descriptor_pool._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                               .super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>.
                               _M_head_impl,source_tree,&parsed_files);
  if (bVar8) {
    output_directories._M_h._M_buckets = &output_directories._M_h._M_single_bucket;
    output_directories._M_h._M_bucket_count = 1;
    output_directories._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    output_directories._M_h._M_element_count = 0;
    output_directories._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    output_directories._M_h._M_rehash_policy._M_next_resize = 0;
    output_directories._M_h._M_single_bucket = (__node_base_ptr)0x0;
    if (this->mode_ == MODE_COMPILE) {
      uVar25 = 0xffffffffffffffff;
      lVar27 = 0;
      do {
        pOVar3 = (this->output_directives_).
                 super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar25 = uVar25 + 1;
        if ((ulong)(((long)(this->output_directives_).
                           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3) / 0x68) <=
            uVar25) goto LAB_0027ddfc;
        std::__cxx11::string::string
                  ((string *)&raw_databases_per_descriptor_set,
                   (string *)((long)&(pOVar3->output_location)._M_dataplus._M_p + lVar27));
        ppDVar7 = raw_databases_per_descriptor_set.
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        sVar16 = stringpiece_internal::StringPiece::CheckSize
                           ((size_type)
                            raw_databases_per_descriptor_set.
                            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        stringpiece_internal::StringPiece::StringPiece(&local_1b8,".zip");
        str_00.length_ = sVar16;
        str_00.ptr_ = (char *)ppDVar7;
        bVar8 = HasSuffixString(str_00,local_1b8);
        ppDVar7 = raw_databases_per_descriptor_set.
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (!bVar8) {
          sVar16 = stringpiece_internal::StringPiece::CheckSize
                             ((size_type)
                              raw_databases_per_descriptor_set.
                              super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
          stringpiece_internal::StringPiece::StringPiece(&local_1c8,".jar");
          str_01.length_ = sVar16;
          str_01.ptr_ = (char *)ppDVar7;
          bVar8 = HasSuffixString(str_01,local_1c8);
          ppDVar7 = raw_databases_per_descriptor_set.
                    super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (!bVar8) {
            sVar16 = stringpiece_internal::StringPiece::CheckSize
                               ((size_type)
                                raw_databases_per_descriptor_set.
                                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
            stringpiece_internal::StringPiece::StringPiece(&local_1d8,".srcjar");
            str_02.length_ = sVar16;
            str_02.ptr_ = (char *)ppDVar7;
            bVar8 = HasSuffixString(str_02,local_1d8);
            if (((!bVar8) &&
                (raw_databases_per_descriptor_set.
                 super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0)) &&
               (pcVar15 = (char *)std::__cxx11::string::at((ulong)&raw_databases_per_descriptor_set)
               , *pcVar15 != '/')) {
              std::__cxx11::string::push_back((char)(key_type *)&raw_databases_per_descriptor_set);
            }
          }
        }
        pmVar17 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&output_directories,(key_type *)&raw_databases_per_descriptor_set)
        ;
        pGVar18 = (pmVar17->_M_t).
                  super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                  .
                  super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                  ._M_head_impl;
        if (pGVar18 == (GeneratorContextImpl *)0x0) {
          pGVar18 = (GeneratorContextImpl *)operator_new(0x48);
          (pGVar18->super_GeneratorContext)._vptr_GeneratorContext =
               (_func_int **)&PTR__GeneratorContextImpl_004d7240;
          (pGVar18->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          (pGVar18->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          p_Var5 = &(pGVar18->files_)._M_t._M_impl.super__Rb_tree_header;
          (pGVar18->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var5->_M_header;
          (pGVar18->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var5->_M_header;
          (pGVar18->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          pGVar18->parsed_files_ = &parsed_files;
          pGVar18->had_error_ = false;
          pGVar4 = (pmVar17->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                   ._M_head_impl;
          (pmVar17->_M_t).
          super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
          .
          super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
          ._M_head_impl = pGVar18;
          if (pGVar4 != (GeneratorContextImpl *)0x0) {
            (*(pGVar4->super_GeneratorContext)._vptr_GeneratorContext[1])();
            pGVar18 = (pmVar17->_M_t).
                      super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                      .
                      super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                      ._M_head_impl;
          }
        }
        bVar8 = GenerateOutput(this,&parsed_files,
                               (OutputDirective *)
                               ((long)&(((this->output_directives_).
                                         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->name).
                                       _M_dataplus._M_p + lVar27),&pGVar18->super_GeneratorContext);
        lVar27 = lVar27 + 0x68;
        std::__cxx11::string::~string((string *)&raw_databases_per_descriptor_set);
      } while (bVar8);
LAB_0027dfc2:
      local_2c0 = 1;
      goto LAB_0027e11c;
    }
LAB_0027ddfc:
    for (_Var24._M_nxt = output_directories._M_h._M_before_begin._M_nxt;
        _Var24._M_nxt != (_Hash_node_base *)0x0; _Var24._M_nxt = (_Var24._M_nxt)->_M_nxt) {
      str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(_Var24._M_nxt + 1)
      ;
      pGVar18 = (GeneratorContextImpl *)_Var24._M_nxt[5]._M_nxt;
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_1e8,str);
      stringpiece_internal::StringPiece::StringPiece(&local_1f8,"/");
      bVar8 = HasSuffixString(local_1e8,local_1f8);
      if (bVar8) {
        bVar8 = GeneratorContextImpl::WriteAllToDisk(pGVar18,str);
      }
      else {
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_208,str);
        stringpiece_internal::StringPiece::StringPiece(&local_218,".jar");
        bVar8 = HasSuffixString(local_208,local_218);
        if (bVar8) {
          GeneratorContextImpl::AddJarManifest(pGVar18);
        }
        bVar8 = GeneratorContextImpl::WriteAllToZip(pGVar18,str);
      }
      if (bVar8 == false) goto LAB_0027dfc2;
    }
    if ((this->dependency_out_name_)._M_string_length == 0) {
LAB_0027df65:
      if (((this->descriptor_set_out_name_)._M_string_length != 0) &&
         (bVar8 = WriteDescriptorSet(this,&parsed_files), !bVar8)) goto LAB_0027e114;
      if (this->mode_ - MODE_ENCODE < 2) {
        if ((this->codec_type_)._M_string_length == 0) {
          DescriptorPool::DescriptorPool((DescriptorPool *)&file_descriptor_set);
          FileDescriptorProto::FileDescriptorProto
                    ((FileDescriptorProto *)&raw_databases_per_descriptor_set);
          raw_databases_per_descriptor_set.
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)raw_databases_per_descriptor_set.
                                super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage | 1);
          puVar22 = (undefined8 *)
                    ((ulong)raw_databases_per_descriptor_set.
                            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xfffffffffffffffc);
          if (((ulong)raw_databases_per_descriptor_set.
                      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
            puVar22 = (undefined8 *)*puVar22;
          }
          internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    (local_98,"empty_message.proto",puVar22);
          pDVar20 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(local_118);
          *(byte *)(pDVar20->_has_bits_).has_bits_ = (byte)(pDVar20->_has_bits_).has_bits_[0] | 1;
          uVar25 = (pDVar20->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar22 = (undefined8 *)(uVar25 & 0xfffffffffffffffc);
          if ((uVar25 & 1) != 0) {
            puVar22 = (undefined8 *)*puVar22;
          }
          internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    (&pDVar20->name_,"EmptyMessage",puVar22);
          pFVar21 = DescriptorPool::BuildFile
                              ((DescriptorPool *)&file_descriptor_set,
                               (FileDescriptorProto *)&raw_databases_per_descriptor_set);
          if (pFVar21 == (FileDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x45f);
            pLVar19 = internal::LogMessage::operator<<
                                (&local_68,"CHECK failed: pool.BuildFile(file) != NULL: ");
            internal::LogFinisher::operator=(&local_291,pLVar19);
            internal::LogMessage::~LogMessage(&local_68);
          }
          std::__cxx11::string::assign((char *)&this->codec_type_);
          bVar8 = EncodeOrDecode(this,(DescriptorPool *)&file_descriptor_set);
          FileDescriptorProto::~FileDescriptorProto
                    ((FileDescriptorProto *)&raw_databases_per_descriptor_set);
          DescriptorPool::~DescriptorPool((DescriptorPool *)&file_descriptor_set);
          if (bVar8) goto LAB_0027e10a;
        }
        else {
          bVar8 = EncodeOrDecode(this,(DescriptorPool *)
                                      descriptor_pool._M_t.
                                      super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                                      .
                                      super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>
                                      ._M_head_impl);
          if (bVar8) goto LAB_0027e10a;
        }
        goto LAB_0027e114;
      }
LAB_0027e10a:
      if ((*(char *)&local_2a8[5]._vptr_MultiFileErrorCollector != '\0') ||
         ((this->fatal_warnings_ == true &&
          (*(char *)((long)&local_2a8[5]._vptr_MultiFileErrorCollector + 1) != '\0'))))
      goto LAB_0027e114;
      local_2c0 = 0;
      if (this->mode_ == MODE_PRINT) {
        if (this->print_mode_ == PRINT_NONE) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&raw_databases_per_descriptor_set,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x47b);
          pLVar19 = internal::LogMessage::operator<<
                              ((LogMessage *)&raw_databases_per_descriptor_set,
                               "If the code reaches here, it usually means a bug of flag parsing in the CommandLineInterface."
                              );
          internal::LogFinisher::operator=((LogFinisher *)&file_descriptor_set,pLVar19);
          internal::LogMessage::~LogMessage((LogMessage *)&raw_databases_per_descriptor_set);
          goto LAB_0027e114;
        }
        if (this->print_mode_ == PRINT_FREE_FIELDS) {
          local_2c0 = 0;
          for (uVar25 = 0;
              uVar25 < (ulong)((long)parsed_files.
                                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)parsed_files.
                                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar25 = uVar25 + 1) {
            pFVar21 = parsed_files.
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar25];
            lVar27 = 0;
            for (lVar28 = 0; lVar28 < *(int *)(pFVar21 + 0x2c); lVar28 = lVar28 + 1) {
              PrintFreeFieldNumbers(this,(Descriptor *)(*(long *)(pFVar21 + 0x58) + lVar27));
              lVar27 = lVar27 + 0x88;
            }
          }
        }
      }
    }
    else {
      if (local_2a0 == (DiskSourceTree *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&raw_databases_per_descriptor_set,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,1099);
        pLVar19 = internal::LogMessage::operator<<
                            ((LogMessage *)&raw_databases_per_descriptor_set,
                             "CHECK failed: disk_source_tree.get(): ");
        internal::LogFinisher::operator=((LogFinisher *)&file_descriptor_set,pLVar19);
        internal::LogMessage::~LogMessage((LogMessage *)&raw_databases_per_descriptor_set);
      }
      bVar8 = GenerateDependencyManifestFile(this,&parsed_files,&output_directories,local_2a0);
      if (bVar8) goto LAB_0027df65;
LAB_0027e114:
      local_2c0 = 1;
    }
LAB_0027e11c:
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&output_directories._M_h);
  }
  else {
    local_2c0 = 1;
  }
  if (local_2b8 != (SourceTreeDescriptorDatabase *)0x0) {
    (*(local_2b8->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])();
  }
LAB_0027e136:
  if (this_02 != (MergedDescriptorDatabase *)0x0) {
    (*(this_02->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])(this_02);
  }
LAB_0027e144:
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::~vector(&databases_per_descriptor_set);
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr(&descriptor_pool);
  if (local_2a8 != (MultiFileErrorCollector *)0x0) {
    (*local_2a8->_vptr_MultiFileErrorCollector[1])(local_2a8);
  }
  if (local_2a0 != (DiskSourceTree *)0x0) {
    (*(local_2a0->super_SourceTree)._vptr_SourceTree[1])(local_2a0);
  }
  std::
  _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Vector_base(&parsed_files.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
  return local_2c0;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();
  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  std::vector<const FileDescriptor*> parsed_files;
  std::unique_ptr<DiskSourceTree> disk_source_tree;
  std::unique_ptr<ErrorPrinter> error_collector;
  std::unique_ptr<DescriptorPool> descriptor_pool;

  // The SimpleDescriptorDatabases here are the constituents of the
  // MergedDescriptorDatabase descriptor_set_in_database, so this vector is for
  // managing their lifetimes. Its scope should match descriptor_set_in_database
  std::vector<std::unique_ptr<SimpleDescriptorDatabase>>
      databases_per_descriptor_set;
  std::unique_ptr<MergedDescriptorDatabase> descriptor_set_in_database;

  std::unique_ptr<SourceTreeDescriptorDatabase> source_tree_database;

  // Any --descriptor_set_in FileDescriptorSet objects will be used as a
  // fallback to input_files on command line, so create that db first.
  if (!descriptor_set_in_names_.empty()) {
    for (const std::string& name : descriptor_set_in_names_) {
      std::unique_ptr<SimpleDescriptorDatabase> database_for_descriptor_set =
          PopulateSingleSimpleDescriptorDatabase(name);
      if (!database_for_descriptor_set) {
        return EXIT_FAILURE;
      }
      databases_per_descriptor_set.push_back(
          std::move(database_for_descriptor_set));
    }

    std::vector<DescriptorDatabase*> raw_databases_per_descriptor_set;
    raw_databases_per_descriptor_set.reserve(
        databases_per_descriptor_set.size());
    for (const std::unique_ptr<SimpleDescriptorDatabase>& db :
         databases_per_descriptor_set) {
      raw_databases_per_descriptor_set.push_back(db.get());
    }
    descriptor_set_in_database.reset(
        new MergedDescriptorDatabase(raw_databases_per_descriptor_set));
  }

  if (proto_path_.empty()) {
    // If there are no --proto_path flags, then just look in the specified
    // --descriptor_set_in files.  But first, verify that the input files are
    // there.
    if (!VerifyInputFilesInDescriptors(descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector.reset(new ErrorPrinter(error_format_));
    descriptor_pool.reset(new DescriptorPool(descriptor_set_in_database.get(),
                                             error_collector.get()));
  } else {
    disk_source_tree.reset(new DiskSourceTree());
    if (!InitializeDiskSourceTree(disk_source_tree.get(),
                                  descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector.reset(
        new ErrorPrinter(error_format_, disk_source_tree.get()));

    source_tree_database.reset(new SourceTreeDescriptorDatabase(
        disk_source_tree.get(), descriptor_set_in_database.get()));
    source_tree_database->RecordErrorsTo(error_collector.get());

    descriptor_pool.reset(new DescriptorPool(
        source_tree_database.get(),
        source_tree_database->GetValidationErrorCollector()));
  }

  descriptor_pool->EnforceWeakDependencies(true);
  if (!ParseInputFiles(descriptor_pool.get(), disk_source_tree.get(),
                       &parsed_files)) {
    return 1;
  }


  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (int i = 0; i < output_directives_.size(); i++) {
      std::string output_location = output_directives_[i].output_location;
      if (!HasSuffixString(output_location, ".zip") &&
          !HasSuffixString(output_location, ".jar") &&
          !HasSuffixString(output_location, ".srcjar")) {
        AddTrailingSlash(&output_location);
      }

      auto& generator = output_directories[output_location];

      if (!generator) {
        // First time we've seen this output location.
        generator.reset(new GeneratorContextImpl(parsed_files));
      }

      if (!GenerateOutput(parsed_files, output_directives_[i],
                          generator.get())) {
        return 1;
      }
    }
  }

  // Write all output to disk.
  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    if (HasSuffixString(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        return 1;
      }
    } else {
      if (HasSuffixString(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    GOOGLE_DCHECK(disk_source_tree.get());
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        disk_source_tree.get())) {
      return 1;
    }
  }

  if (!descriptor_set_out_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      GOOGLE_CHECK(pool.BuildFile(file) != NULL);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(descriptor_pool.get())) {
        return 1;
      }
    }
  }

  if (error_collector->FoundErrors() ||
      (fatal_warnings_ && error_collector->FoundWarnings())) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (int i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        GOOGLE_LOG(ERROR) << "If the code reaches here, it usually means a bug of "
                      "flag parsing in the CommandLineInterface.";
        return 1;

        // Do not add a default case.
    }
  }

  return 0;
}